

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O0

void __thiscall OpenMD::InteractionManager::doPair(InteractionManager *this,InteractionData *idat)

{
  reference this_00;
  uint *puVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  int *in_RSI;
  long in_RDI;
  int *iHash;
  InteractionManager *in_stack_00000d00;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000d00);
  }
  this_00 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x110),(long)*in_RSI);
  puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)in_RSI[1]);
  if ((*puVar1 & 1) != 0) {
    peVar2 = std::
             __shared_ptr_access<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::Electrostatic,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e2e34);
    (*(peVar2->super_ElectrostaticInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
      [2])(peVar2,in_RSI);
  }
  if ((*(byte *)(in_RSI + 0x13) & 1) == 0) {
    if ((*puVar1 & 2) != 0) {
      peVar3 = std::__shared_ptr_access<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::LJ,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e2e6f);
      (*(peVar3->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar3,in_RSI);
    }
    if ((*puVar1 & 0x20) != 0) {
      peVar4 = std::__shared_ptr_access<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::GB,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e2e9a);
      (*(peVar4->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar4,in_RSI);
    }
    if ((*puVar1 & 0x10) != 0) {
      peVar5 = std::__shared_ptr_access<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::Sticky,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e2ec5);
      (*(peVar5->super_HydrogenBondingInteraction).super_NonBondedInteraction.
        _vptr_NonBondedInteraction[2])(peVar5,in_RSI);
    }
    if ((*puVar1 & 0x40) != 0) {
      peVar6 = std::__shared_ptr_access<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::Morse,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e2ef0);
      (*(peVar6->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar6,in_RSI);
    }
    if ((*puVar1 & 0x80) != 0) {
      peVar7 = std::
               __shared_ptr_access<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::RepulsivePower,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2e2f20);
      (*(peVar7->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar7,in_RSI);
    }
    if ((*puVar1 & 0x200) != 0) {
      peVar8 = std::__shared_ptr_access<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::Mie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e2f50);
      (*(peVar8->super_VanDerWaalsInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar8,in_RSI);
    }
    if ((*puVar1 & 4) != 0) {
      peVar9 = std::__shared_ptr_access<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<OpenMD::EAM,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e2f7b);
      (*(peVar9->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction[2]
      )(peVar9,in_RSI);
    }
    if ((*puVar1 & 8) != 0) {
      peVar10 = std::__shared_ptr_access<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<OpenMD::SC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e2fa6);
      (*(peVar10->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction
        [2])(peVar10,in_RSI);
    }
    if ((*puVar1 & 0x100) != 0) {
      peVar11 = std::__shared_ptr_access<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<OpenMD::MAW,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e2fd6);
      (*(peVar11->super_VanDerWaalsInteraction).super_NonBondedInteraction.
        _vptr_NonBondedInteraction[2])(peVar11,in_RSI);
    }
    if ((*puVar1 & 0x800) != 0) {
      peVar12 = std::
                __shared_ptr_access<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<OpenMD::InversePowerSeries,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x2e3006);
      (*(peVar12->super_VanDerWaalsInteraction).super_NonBondedInteraction.
        _vptr_NonBondedInteraction[2])(peVar12,in_RSI);
    }
  }
  return;
}

Assistant:

void InteractionManager::doPair(InteractionData& idat) {
    if (!initialized_) initialize();

    int& iHash = iHash_[idat.atid1][idat.atid2];

    if ((iHash & ELECTROSTATIC_INTERACTION) != 0)
      electrostatic_->calcForce(idat);

    // electrostatics still has to worry about indirect
    // contributions from excluded pairs of atoms, but nothing else does:

    if (idat.excluded) return;

    if ((iHash & LJ_INTERACTION) != 0) lj_->calcForce(idat);
    if ((iHash & GB_INTERACTION) != 0) gb_->calcForce(idat);
    if ((iHash & STICKY_INTERACTION) != 0) sticky_->calcForce(idat);
    if ((iHash & MORSE_INTERACTION) != 0) morse_->calcForce(idat);
    if ((iHash & REPULSIVEPOWER_INTERACTION) != 0)
      repulsivePower_->calcForce(idat);
    if ((iHash & MIE_INTERACTION) != 0) mie_->calcForce(idat);
    if ((iHash & EAM_INTERACTION) != 0) eam_->calcForce(idat);
    if ((iHash & SC_INTERACTION) != 0) sc_->calcForce(idat);
    if ((iHash & MAW_INTERACTION) != 0) maw_->calcForce(idat);
    if ((iHash & INVERSEPOWERSERIES_INTERACTION) != 0)
      inversePowerSeries_->calcForce(idat);

    // set<NonBondedInteraction*>::iterator it;
    //
    // for (it = interactions_[ idat.atypes ].begin();
    //      it != interactions_[ idat.atypes ].end(); ++it) {
    //
    //   if (!idat.excluded || (*it)->getFamily() == ELECTROSTATIC_FAMILY) {
    //     (*it)->calcForce(idat);
    //   }
    // }

    return;
  }